

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

bool __thiscall CProfileNode::Return(CProfileNode *this)

{
  int iVar1;
  long in_RDI;
  float fVar2;
  unsigned_long time;
  float local_1c;
  long local_10;
  
  iVar1 = *(int *)(in_RDI + 0x18) + -1;
  *(int *)(in_RDI + 0x18) = iVar1;
  if ((iVar1 == 0) && (*(int *)(in_RDI + 8) != 0)) {
    Profile_Get_Ticks((unsigned_long *)0x15688e);
    local_1c = (float)(ulong)(local_10 - *(long *)(in_RDI + 0x10));
    fVar2 = Profile_Get_Tick_Rate();
    *(float *)(in_RDI + 0xc) = local_1c / fVar2 + *(float *)(in_RDI + 0xc);
  }
  return *(int *)(in_RDI + 0x18) == 0;
}

Assistant:

bool	CProfileNode::Return( void )
{
	if ( --RecursionCounter == 0 && TotalCalls != 0 ) {
		unsigned long int time;
		Profile_Get_Ticks(&time);
		time-=StartTime;
		TotalTime += (float)time / Profile_Get_Tick_Rate();
	}
	return ( RecursionCounter == 0 );
}